

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void set_cb_buffer(AV1Decoder *pbi,DecoderCodingBlock *dcb,CB_BUFFER *cb_buffer_base,int num_planes,
                  int mi_row,int mi_col)

{
  int iVar1;
  byte bVar2;
  MACROBLOCKD *xd;
  int plane;
  CB_BUFFER *cb_buffer;
  int offset;
  int stride;
  int mib_size_log2;
  AV1_COMMON *cm;
  int mi_col_local;
  int mi_row_local;
  int num_planes_local;
  CB_BUFFER *cb_buffer_base_local;
  DecoderCodingBlock *dcb_local;
  AV1Decoder *pbi_local;
  
  bVar2 = (byte)((pbi->common).seq_params)->mib_size_log2;
  iVar1 = (mi_row >> (bVar2 & 0x1f)) * (((pbi->common).mi_params.mi_cols >> (bVar2 & 0x1f)) + 1) +
          (mi_col >> (bVar2 & 0x1f));
  for (plane = 0; plane < num_planes; plane = plane + 1) {
    dcb->dqcoeff_block[plane] = cb_buffer_base[iVar1].dqcoeff[plane];
    dcb->eob_data[plane] = cb_buffer_base[iVar1].eob_data[plane];
    dcb->cb_offset[plane] = 0;
    dcb->txb_offset[plane] = 0;
  }
  (dcb->xd).plane[0].color_index_map = cb_buffer_base[iVar1].color_index_map[0];
  (dcb->xd).plane[1].color_index_map = cb_buffer_base[iVar1].color_index_map[1];
  (dcb->xd).color_index_map_offset[0] = 0;
  (dcb->xd).color_index_map_offset[1] = 0;
  return;
}

Assistant:

static inline void set_cb_buffer(AV1Decoder *pbi, DecoderCodingBlock *dcb,
                                 CB_BUFFER *cb_buffer_base,
                                 const int num_planes, int mi_row, int mi_col) {
  AV1_COMMON *const cm = &pbi->common;
  int mib_size_log2 = cm->seq_params->mib_size_log2;
  int stride = (cm->mi_params.mi_cols >> mib_size_log2) + 1;
  int offset = (mi_row >> mib_size_log2) * stride + (mi_col >> mib_size_log2);
  CB_BUFFER *cb_buffer = cb_buffer_base + offset;

  for (int plane = 0; plane < num_planes; ++plane) {
    dcb->dqcoeff_block[plane] = cb_buffer->dqcoeff[plane];
    dcb->eob_data[plane] = cb_buffer->eob_data[plane];
    dcb->cb_offset[plane] = 0;
    dcb->txb_offset[plane] = 0;
  }
  MACROBLOCKD *const xd = &dcb->xd;
  xd->plane[0].color_index_map = cb_buffer->color_index_map[0];
  xd->plane[1].color_index_map = cb_buffer->color_index_map[1];
  xd->color_index_map_offset[0] = 0;
  xd->color_index_map_offset[1] = 0;
}